

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::OneHotEncoder::OneHotEncoder(OneHotEncoder *this,OneHotEncoder *from)

{
  undefined3 uVar1;
  int iVar2;
  Int64Vector *this_00;
  StringVector *this_01;
  undefined1 *puVar3;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__OneHotEncoder_00403c28;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  uVar1 = *(undefined3 *)&from->field_0x11;
  iVar2 = from->handleunknown_;
  this->outputsparse_ = from->outputsparse_;
  *(undefined3 *)&this->field_0x11 = uVar1;
  this->handleunknown_ = iVar2;
  this->_oneof_case_[0] = 0;
  if (from->_oneof_case_[0] == 1) {
    this_01 = _internal_mutable_stringcategories(this);
    if (from->_oneof_case_[0] == 1) {
      puVar3 = (undefined1 *)(from->CategoryType_).stringcategories_;
    }
    else {
      puVar3 = _StringVector_default_instance_;
    }
    StringVector::MergeFrom(this_01,(StringVector *)puVar3);
  }
  else if (from->_oneof_case_[0] == 2) {
    this_00 = _internal_mutable_int64categories(this);
    if (from->_oneof_case_[0] == 2) {
      puVar3 = (undefined1 *)(from->CategoryType_).int64categories_;
    }
    else {
      puVar3 = _Int64Vector_default_instance_;
    }
    Int64Vector::MergeFrom(this_00,(Int64Vector *)puVar3);
  }
  return;
}

Assistant:

OneHotEncoder::OneHotEncoder(const OneHotEncoder& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  ::memcpy(&outputsparse_, &from.outputsparse_,
    static_cast<size_t>(reinterpret_cast<char*>(&handleunknown_) -
    reinterpret_cast<char*>(&outputsparse_)) + sizeof(handleunknown_));
  clear_has_CategoryType();
  switch (from.CategoryType_case()) {
    case kStringCategories: {
      _internal_mutable_stringcategories()->::CoreML::Specification::StringVector::MergeFrom(from._internal_stringcategories());
      break;
    }
    case kInt64Categories: {
      _internal_mutable_int64categories()->::CoreML::Specification::Int64Vector::MergeFrom(from._internal_int64categories());
      break;
    }
    case CATEGORYTYPE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.OneHotEncoder)
}